

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.h
# Opt level: O0

void __thiscall Basic_Longer_Test::TestBody(Basic_Longer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_250;
  Message local_248;
  string local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_3;
  Message local_208;
  string local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  Message local_1c8;
  string local_1c0;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  BigNumber num_4;
  BigNumber num_3;
  BigNumber num_2;
  BigNumber num_1;
  int i;
  string numStr_4;
  string numStr_3;
  allocator local_51;
  undefined1 local_50 [8];
  string numStr_2;
  string numStr_1;
  Basic_Longer_Test *this_local;
  
  std::__cxx11::string::string((string *)(numStr_2.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"-",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::string((string *)(numStr_4.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"-",(allocator *)&num_1.field_0x27);
  std::allocator<char>::~allocator((allocator<char> *)&num_1.field_0x27);
  for (num_1.m_symbol = POSITIVE; num_1.m_symbol < 0x10001;
      num_1.m_symbol = num_1.m_symbol + POSITIVE) {
    std::__cxx11::string::operator+=
              ((string *)(numStr_2.field_2._M_local_buf + 8),
               (char)num_1.m_symbol + (char)(num_1.m_symbol / 9) * -9 + '0');
    std::__cxx11::string::operator+=
              ((string *)local_50,
               (char)num_1.m_symbol + '0' +
               ((char)(uint)((ulong)((long)num_1.m_symbol * 0x92492493) >> 0x22) -
               (char)(num_1.m_symbol >> 0x1f)) * -7);
    std::__cxx11::string::operator+=
              ((string *)(numStr_4.field_2._M_local_buf + 8),
               (char)num_1.m_symbol + (char)(num_1.m_symbol / 5) * -5 + '0');
    std::__cxx11::string::operator+=
              ((string *)&i,(char)num_1.m_symbol + (char)(num_1.m_symbol / 3) * -3 + '0');
  }
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)((long)&numStr_2.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)local_50);
  BigNumber::BigNumber((BigNumber *)&num_4.m_symbol,(string *)((long)&numStr_4.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&gtest_ar.message_,(string *)&i);
  BigNumber::toString_abi_cxx11_(&local_180,(BigNumber *)&num_2.m_symbol);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_160,"numStr_1","num_1.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_2.field_2 + 8),&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  BigNumber::toString_abi_cxx11_(&local_1c0,(BigNumber *)&num_3.m_symbol);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1a0,"numStr_2","num_2.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             &local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  BigNumber::toString_abi_cxx11_(&local_200,(BigNumber *)&num_4.m_symbol);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1e0,"numStr_3","num_3.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_4.field_2 + 8),&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  BigNumber::toString_abi_cxx11_(&local_240,(BigNumber *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_220,"numStr_4","num_4.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  BigNumber::~BigNumber((BigNumber *)&gtest_ar.message_);
  BigNumber::~BigNumber((BigNumber *)&num_4.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)(numStr_4.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(numStr_2.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST(Basic, Longer)
{
    std::string numStr_1, numStr_2 = "-", numStr_3, numStr_4 = "-";
    for (int i = 1; i <= 65536; i++)
    {
        numStr_1 += (i % 9) + '0';
        numStr_2 += (i % 7) + '0';
        numStr_3 += (i % 5) + '0';
        numStr_4 += (i % 3) + '0';
    }
    BigNumber num_1 = numStr_1;
    BigNumber num_2 = numStr_2;
    BigNumber num_3 = numStr_3;
    BigNumber num_4 = numStr_4;
    EXPECT_EQ(numStr_1, num_1.toString());
    EXPECT_EQ(numStr_2, num_2.toString());
    EXPECT_EQ(numStr_3, num_3.toString());
    EXPECT_EQ(numStr_4, num_4.toString());
}